

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

char * nullcGetArgumentVector(uint functionID,uintptr_t extra,__va_list_tag *args)

{
  uint uVar1;
  SubCategory SVar2;
  uintptr_t uVar3;
  int iVar4;
  ExternFuncInfo *pEVar5;
  ExternLocalInfo *pEVar6;
  ExternTypeInfo *pEVar7;
  ExternMemberInfo *pEVar8;
  ExternTypeInfo *pEVar9;
  float *pfVar10;
  uintptr_t *puVar11;
  double *pdVar12;
  uint uVar13;
  uint k;
  ulong uVar14;
  float *pfVar15;
  long lStack_50;
  
  pEVar5 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                     ((FastVector<ExternFuncInfo,_false,_false> *)(NULLC::linker + 0x240),functionID
                     );
  uVar13 = 0;
  pfVar15 = NULLC::argBuf;
  do {
    if (pEVar5->paramCount <= uVar13) {
      *(uintptr_t *)pfVar15 = extra;
      return (char *)NULLC::argBuf;
    }
    pEVar6 = FastVector<ExternLocalInfo,_false,_false>::operator[]
                       ((FastVector<ExternLocalInfo,_false,_false> *)(NULLC::linker + 0x270),
                        pEVar5->offsetToFirstLocal + uVar13);
    pEVar7 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(NULLC::linker + 0x200),
                        pEVar6->type);
    switch(pEVar7->type) {
    case TYPE_COMPLEX:
      if ((nullcGetArgumentVector(unsigned_int,unsigned_long,__va_list_tag*)::autoRefHash == '\0')
         && (iVar4 = __cxa_guard_acquire(&nullcGetArgumentVector(unsigned_int,unsigned_long,__va_list_tag*)
                                          ::autoRefHash), iVar4 != 0)) {
        nullcGetArgumentVector::autoRefHash = NULLC::GetStringHash("auto ref");
        __cxa_guard_release(&nullcGetArgumentVector(unsigned_int,unsigned_long,__va_list_tag*)::
                             autoRefHash);
      }
      if ((nullcGetArgumentVector(unsigned_int,unsigned_long,__va_list_tag*)::autoArrayHash == '\0')
         && (iVar4 = __cxa_guard_acquire(&nullcGetArgumentVector(unsigned_int,unsigned_long,__va_list_tag*)
                                          ::autoArrayHash), iVar4 != 0)) {
        nullcGetArgumentVector::autoArrayHash = NULLC::GetStringHash("auto[]");
        __cxa_guard_release(&nullcGetArgumentVector(unsigned_int,unsigned_long,__va_list_tag*)::
                             autoArrayHash);
      }
      SVar2 = pEVar7->subCat;
      if ((SVar2 != CAT_FUNCTION) && ((pEVar7->field_8).arrSize != 0xffffffff || SVar2 != CAT_ARRAY)
         ) {
        if (pEVar7->nameHash == nullcGetArgumentVector::autoRefHash) {
          puVar11 = (uintptr_t *)args->overflow_arg_area;
          args->overflow_arg_area = puVar11 + 2;
          uVar3 = *puVar11;
          pfVar15[2] = *(float *)(puVar11 + 1);
          *(uintptr_t *)pfVar15 = uVar3;
          pfVar15 = pfVar15 + 3;
        }
        else if (pEVar7->nameHash == nullcGetArgumentVector::autoArrayHash) {
          puVar11 = (uintptr_t *)args->overflow_arg_area;
          args->overflow_arg_area = puVar11 + 2;
          uVar3 = puVar11[1];
          *(uintptr_t *)pfVar15 = *puVar11;
          *(uintptr_t *)(pfVar15 + 2) = uVar3;
          pfVar15 = pfVar15 + 4;
        }
        else {
          if (SVar2 != CAT_CLASS) {
switchD_001f3a77_default:
            NULLC::nullcLastError = "ERROR: unsupported complex function parameter";
            return (char *)0x0;
          }
          pEVar8 = FastVector<ExternMemberInfo,_false,_false>::operator[]
                             ((FastVector<ExternMemberInfo,_false,_false> *)(NULLC::linker + 0x210),
                              (pEVar7->field_11).subType);
          for (uVar14 = 0; uVar14 < (pEVar7->field_8).arrSize; uVar14 = uVar14 + 1) {
            pEVar9 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                               ((FastVector<ExternTypeInfo,_false,_false> *)(NULLC::linker + 0x200),
                                pEVar8->type);
            switch(pEVar9->type) {
            case TYPE_INT:
            case TYPE_SHORT:
            case TYPE_CHAR:
              uVar1 = args->gp_offset;
              if ((ulong)uVar1 < 0x29) {
                pfVar10 = (float *)((ulong)uVar1 + (long)args->reg_save_area);
                args->gp_offset = uVar1 + 8;
              }
              else {
                pfVar10 = (float *)args->overflow_arg_area;
                args->overflow_arg_area = pfVar10 + 2;
              }
              *pfVar15 = *pfVar10;
              break;
            case TYPE_FLOAT:
              uVar1 = args->fp_offset;
              if ((ulong)uVar1 < 0xa1) {
                pdVar12 = (double *)((ulong)uVar1 + (long)args->reg_save_area);
                args->fp_offset = uVar1 + 0x10;
              }
              else {
                pdVar12 = (double *)args->overflow_arg_area;
                args->overflow_arg_area = pdVar12 + 1;
              }
              *pfVar15 = (float)*pdVar12;
              break;
            case TYPE_LONG:
              uVar1 = args->gp_offset;
              if ((ulong)uVar1 < 0x29) {
                puVar11 = (uintptr_t *)((ulong)uVar1 + (long)args->reg_save_area);
                args->gp_offset = uVar1 + 8;
              }
              else {
                puVar11 = (uintptr_t *)args->overflow_arg_area;
                args->overflow_arg_area = puVar11 + 1;
              }
              *(uintptr_t *)pfVar15 = *puVar11;
              goto LAB_001f3b38;
            case TYPE_DOUBLE:
              uVar1 = args->fp_offset;
              if ((ulong)uVar1 < 0xa1) {
                puVar11 = (uintptr_t *)((ulong)uVar1 + (long)args->reg_save_area);
                args->fp_offset = uVar1 + 0x10;
              }
              else {
                puVar11 = (uintptr_t *)args->overflow_arg_area;
                args->overflow_arg_area = puVar11 + 1;
              }
              *(uintptr_t *)pfVar15 = *puVar11;
LAB_001f3b38:
              lStack_50 = 8;
              goto LAB_001f3b3a;
            default:
              goto switchD_001f3a77_default;
            }
            lStack_50 = 4;
LAB_001f3b3a:
            pfVar15 = (float *)((long)pfVar15 + lStack_50);
            pEVar8 = pEVar8 + 1;
          }
        }
        goto switchD_001f384c_caseD_1;
      }
      uVar1 = args->gp_offset;
      if ((ulong)uVar1 < 0x21) {
        puVar11 = (uintptr_t *)((ulong)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 0x10;
      }
      else {
        puVar11 = (uintptr_t *)args->overflow_arg_area;
        args->overflow_arg_area = puVar11 + 2;
      }
      uVar3 = *puVar11;
      pfVar15[2] = *(float *)(puVar11 + 1);
      *(uintptr_t *)pfVar15 = uVar3;
      pfVar15 = pfVar15 + 3;
      break;
    default:
switchD_001f384c_caseD_1:
      break;
    case TYPE_INT:
    case TYPE_SHORT:
    case TYPE_CHAR:
      uVar1 = args->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        pfVar10 = (float *)((ulong)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 8;
      }
      else {
        pfVar10 = (float *)args->overflow_arg_area;
        args->overflow_arg_area = pfVar10 + 2;
      }
      *pfVar15 = *pfVar10;
      goto LAB_001f39b7;
    case TYPE_FLOAT:
      uVar1 = args->fp_offset;
      if ((ulong)uVar1 < 0xa1) {
        pdVar12 = (double *)((ulong)uVar1 + (long)args->reg_save_area);
        args->fp_offset = uVar1 + 0x10;
      }
      else {
        pdVar12 = (double *)args->overflow_arg_area;
        args->overflow_arg_area = pdVar12 + 1;
      }
      *pfVar15 = (float)*pdVar12;
LAB_001f39b7:
      pfVar15 = pfVar15 + 1;
      break;
    case TYPE_LONG:
      uVar1 = args->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        puVar11 = (uintptr_t *)((ulong)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 8;
      }
      else {
        puVar11 = (uintptr_t *)args->overflow_arg_area;
        args->overflow_arg_area = puVar11 + 1;
      }
      *(uintptr_t *)pfVar15 = *puVar11;
      goto LAB_001f3994;
    case TYPE_DOUBLE:
      uVar1 = args->fp_offset;
      if ((ulong)uVar1 < 0xa1) {
        puVar11 = (uintptr_t *)((ulong)uVar1 + (long)args->reg_save_area);
        args->fp_offset = uVar1 + 0x10;
      }
      else {
        puVar11 = (uintptr_t *)args->overflow_arg_area;
        args->overflow_arg_area = puVar11 + 1;
      }
      *(uintptr_t *)pfVar15 = *puVar11;
LAB_001f3994:
      pfVar15 = pfVar15 + 2;
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

const char*	nullcGetArgumentVector(unsigned functionID, uintptr_t extra, va_list args)
{
	using namespace NULLC;

	// Copy arguments in argument buffer
	ExternFuncInfo	&func = linker->exFunctions[functionID];
	char *argPos = argBuf;
	for(unsigned i = 0; i < func.paramCount; i++)
	{
		ExternLocalInfo &lInfo = linker->exLocals[func.offsetToFirstLocal + i];
		ExternTypeInfo &tInfo = linker->exTypes[lInfo.type];
		switch(tInfo.type)
		{
		case ExternTypeInfo::TYPE_VOID:
			break;
		case ExternTypeInfo::TYPE_CHAR:
		case ExternTypeInfo::TYPE_SHORT:
		case ExternTypeInfo::TYPE_INT:
			*(int*)argPos = va_arg(args, int);
			argPos += 4;
			break;
		case ExternTypeInfo::TYPE_LONG:
			*(long long*)argPos = va_arg(args, long long);
			argPos += 8;
			break;
		case ExternTypeInfo::TYPE_FLOAT:
			*(float*)argPos = (float)va_arg(args, double);
			argPos += 4;
			break;
		case ExternTypeInfo::TYPE_DOUBLE:
			*(double*)argPos = va_arg(args, double);
			argPos += 8;
			break;
		case ExternTypeInfo::TYPE_COMPLEX:
			static unsigned autoRefHash = GetStringHash("auto ref");
			static unsigned autoArrayHash = GetStringHash("auto[]");
#ifdef _WIN64
			if(tInfo.size <= 4)
				*(int*)argPos = va_arg(args, int);
			else if(tInfo.size <= 8)
				*(long long*)argPos = va_arg(args, long long);
			else
				memcpy(argPos, va_arg(args, char*), tInfo.size);
			argPos += tInfo.size;
#elif defined(__aarch64__)
			if(tInfo.size <= 4)
			{
				*(int*)argPos = va_arg(args, int);
			}
			else if(tInfo.size <= 8)
			{
				*(long long*)argPos = va_arg(args, long long);
			}
			else if(tInfo.size <= 12)
			{
				*(long long*)argPos = va_arg(args, long long);
				*(long long*)(argPos + 8) = va_arg(args, long long);
			}
			else if(tInfo.size <= 16)
			{
				*(long long*)argPos = va_arg(args, long long);
				*(long long*)(argPos + 8) = va_arg(args, long long);
			}
			else
			{
				memcpy(argPos, va_arg(args, char*), tInfo.size);
			}
			argPos += tInfo.size;
#elif defined(__x86_64__)
			if((tInfo.subCat == ExternTypeInfo::CAT_ARRAY && tInfo.arrSize == ~0u) || tInfo.subCat == ExternTypeInfo::CAT_FUNCTION)
			{
				*(NULLCArray*)argPos = va_arg(args, NULLCArray);
				argPos += 12;
			}else if(tInfo.nameHash == autoRefHash){
				*(NULLCRef*)argPos = va_arg(args, NULLCRef);
				argPos += 12;
			}else if(tInfo.nameHash == autoArrayHash){
				*(NULLCAutoArray*)argPos = va_arg(args, NULLCAutoArray);
				argPos += sizeof(NULLCAutoArray);
			}else if(tInfo.subCat == ExternTypeInfo::CAT_CLASS){
				ExternMemberInfo *memberList = &linker->exTypeExtra[tInfo.memberOffset];
				for(unsigned k = 0; k < tInfo.memberCount; k++)
				{
					const ExternTypeInfo &subType = linker->exTypes[memberList[k].type];
					switch(subType.type)
					{
					case ExternTypeInfo::TYPE_CHAR:
					case ExternTypeInfo::TYPE_SHORT:
					case ExternTypeInfo::TYPE_INT:
						*(int*)argPos = va_arg(args, int);
						argPos += 4;
						break;
					case ExternTypeInfo::TYPE_LONG:
						*(long long*)argPos = va_arg(args, long long);
						argPos += 8;
						break;
					case ExternTypeInfo::TYPE_FLOAT:
						*(float*)argPos = (float)va_arg(args, double);
						argPos += 4;
						break;
					case ExternTypeInfo::TYPE_DOUBLE:
						*(double*)argPos = va_arg(args, double);
						argPos += 8;
						break;
					default:
						nullcLastError = "ERROR: unsupported complex function parameter";
						return NULL;
					}
				}
			}else{
				nullcLastError = "ERROR: unsupported complex function parameter";
				return NULL;
			}
#else
			for(unsigned u = 0; u < tInfo.size >> 2; u++, argPos += 4)
				*(int*)argPos = va_arg(args, int);
#endif
			break;
		}
	}

	memcpy(argPos, &extra, sizeof(extra));
	argPos += sizeof(uintptr_t);

	return argBuf;
}